

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_read_double(coda_cursor *cursor,double *dst)

{
  int iVar1;
  double *dst_local;
  coda_cursor *cursor_local;
  
  iVar1 = read_double(cursor,dst);
  return iVar1;
}

Assistant:

int coda_bin_cursor_read_double(const coda_cursor *cursor, double *dst)
{
    return read_double(cursor, dst);
}